

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

bool jbcoin::amountFromJsonNoThrow(STAmount *result,Value *jvSource)

{
  STAmount local_190 [5];
  
  amountFromJson(local_190,(SField *)sfGeneric,jvSource);
  STAmount::operator=(result,local_190);
  return true;
}

Assistant:

bool
amountFromJsonNoThrow (STAmount& result, Json::Value const& jvSource)
{
    try
    {
        result = amountFromJson (sfGeneric, jvSource);
        return true;
    }
    catch (const std::exception& e)
    {
        JLOG (debugLog().warn()) <<
            "amountFromJsonNoThrow: caught: " << e.what ();
    }
    return false;
}